

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_5401fb::SQLiteBuildDB::setRuleResult
          (SQLiteBuildDB *this,KeyID keyID,Rule *rule,Result *ruleResult,string *error_out)

{
  byte bVar1;
  int iVar2;
  DBKeyID DVar3;
  pointer puVar4;
  int __oflag;
  void *__buf;
  void *__buf_00;
  bool bVar5;
  long lVar6;
  long lVar7;
  BinaryEncoder encoder;
  string local_178;
  long local_158;
  uint64_t local_150;
  Result *local_148;
  BinaryEncoder local_140;
  
  if (this->delegate == (BuildDBDelegate *)0x0) {
    __assert_fail("delegate != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                  ,0x25d,
                  "virtual bool (anonymous namespace)::SQLiteBuildDB::setRuleResult(KeyID, const Rule &, const Result &, std::string *)"
                 );
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->dbMutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  iVar2 = open(this,(char *)error_out,__oflag);
  if (((char)iVar2 == '\0') ||
     (DVar3 = getKeyID(this,keyID,error_out), error_out->_M_string_length != 0)) {
    bVar5 = false;
    goto LAB_001d2dcc;
  }
  local_140.encdata.super_SmallVectorImpl<unsigned_char>.
  super_SmallVectorTemplateBase<unsigned_char,_true>.
  super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX =
       &local_140.encdata.super_SmallVectorStorage<unsigned_char,_256U>;
  local_140.encdata.super_SmallVectorImpl<unsigned_char>.
  super_SmallVectorTemplateBase<unsigned_char,_true>.
  super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size = 0;
  local_140.encdata.super_SmallVectorImpl<unsigned_char>.
  super_SmallVectorTemplateBase<unsigned_char,_true>.
  super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Capacity = 0x100;
  local_158 = (long)(ruleResult->dependencies).keys.
                    super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(ruleResult->dependencies).keys.
                    super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>.
                    _M_impl.super__Vector_impl_data._M_start;
  local_150 = DVar3.value;
  if (local_158 != 0) {
    local_158 = local_158 >> 3;
    lVar6 = 0;
    lVar7 = 0;
    local_148 = ruleResult;
    do {
      puVar4 = (local_148->dependencies).flags.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar1 = puVar4[lVar6 >> 0x20];
      DVar3 = getKeyID(this,(KeyID)(local_148->dependencies).keys.
                                   super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar7]._value,error_out
                      );
      if (error_out->_M_string_length != 0) goto LAB_001d2fbf;
      llbuild::basic::BinaryEncoder::write
                (&local_140,(bVar1 & 3) + (int)DVar3.value * 4,__buf,(size_t)puVar4);
      llbuild::basic::BinaryEncoder::write
                (&local_140,(int)(DVar3.value >> 0x1e),__buf_00,(size_t)puVar4);
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x100000000;
      ruleResult = local_148;
    } while (local_158 != lVar7);
  }
  iVar2 = sqlite3_reset(this->insertIntoRuleResultsStmt);
  if ((((((iVar2 == 0) &&
         (iVar2 = sqlite3_clear_bindings(this->insertIntoRuleResultsStmt), iVar2 == 0)) &&
        (iVar2 = sqlite3_bind_int64(this->insertIntoRuleResultsStmt,1,local_150), iVar2 == 0)) &&
       ((puVar4 = (ruleResult->value).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start,
        iVar2 = sqlite3_bind_blob(this->insertIntoRuleResultsStmt,2,puVar4,
                                  *(int *)&(ruleResult->value).
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (int)puVar4,
                                  0), iVar2 == 0 &&
        (iVar2 = sqlite3_bind_int64(this->insertIntoRuleResultsStmt,3,(ruleResult->signature).value)
        , iVar2 == 0)))) &&
      ((iVar2 = sqlite3_bind_int64(this->insertIntoRuleResultsStmt,4,ruleResult->builtAt),
       iVar2 == 0 &&
       ((iVar2 = sqlite3_bind_int64(this->insertIntoRuleResultsStmt,5,ruleResult->computedAt),
        iVar2 == 0 &&
        (iVar2 = sqlite3_bind_double(ruleResult->start,this->insertIntoRuleResultsStmt,6),
        iVar2 == 0)))))) &&
     ((iVar2 = sqlite3_bind_double(ruleResult->end,this->insertIntoRuleResultsStmt,7), iVar2 == 0 &&
      (iVar2 = sqlite3_bind_blob(this->insertIntoRuleResultsStmt,8,
                                 local_140.encdata.super_SmallVectorImpl<unsigned_char>.
                                 super_SmallVectorTemplateBase<unsigned_char,_true>.
                                 super_SmallVectorTemplateCommon<unsigned_char,_void>.
                                 super_SmallVectorBase.BeginX,
                                 local_140.encdata.super_SmallVectorImpl<unsigned_char>.
                                 super_SmallVectorTemplateBase<unsigned_char,_true>.
                                 super_SmallVectorTemplateCommon<unsigned_char,_void>.
                                 super_SmallVectorBase._8_8_ & 0xffffffff,0), iVar2 == 0)))) {
    iVar2 = sqlite3_step(this->insertIntoRuleResultsStmt);
    bVar5 = true;
    if (iVar2 != 0x65) goto LAB_001d2f92;
  }
  else {
LAB_001d2f92:
    (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_178,this);
    std::__cxx11::string::operator=((string *)error_out,(string *)&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
LAB_001d2fbf:
    bVar5 = false;
  }
  if ((SmallVectorStorage<unsigned_char,_256U> *)
      local_140.encdata.super_SmallVectorImpl<unsigned_char>.
      super_SmallVectorTemplateBase<unsigned_char,_true>.
      super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX !=
      &local_140.encdata.super_SmallVectorStorage<unsigned_char,_256U>) {
    free(local_140.encdata.super_SmallVectorImpl<unsigned_char>.
         super_SmallVectorTemplateBase<unsigned_char,_true>.
         super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX);
  }
LAB_001d2dcc:
  pthread_mutex_unlock((pthread_mutex_t *)&this->dbMutex);
  return bVar5;
}

Assistant:

virtual bool setRuleResult(KeyID keyID,
                             const Rule& rule,
                             const Result& ruleResult,
                             std::string *error_out) override {
    assert(delegate != nullptr);
    std::lock_guard<std::mutex> guard(dbMutex);
    int result;

    if (!open(error_out)) {
      return false;
    }

    auto dbKeyID = getKeyID(keyID, error_out);
    if (!error_out->empty()) {
      return false;
    }

    // Create the encoded dependency list.
    //
    // FIXME: We could save some reallocation by having a templated SmallVector
    // size here.
    basic::BinaryEncoder encoder{};
    for (auto dependency: ruleResult.dependencies) {
      // Map the enging keyID to a database key ID
      //
      // FIXME: This is naively mapping all keys with no caching at this point,
      // thus likely to perform poorly.  Should refactor this into a bulk
      // query or a DB layer cache.
      auto dbKeyID = getKeyID(dependency.keyID, error_out);
      if (!error_out->empty()) {
        return false;
      }
      encoder.write((dbKeyID.value << 2) + (dependency.singleUse << 1) + dependency.orderOnly);
    }

    // Insert the actual rule result.
    result = sqlite3_reset(insertIntoRuleResultsStmt);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_clear_bindings(insertIntoRuleResultsStmt);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_int64(insertIntoRuleResultsStmt, /*index=*/1,
                               dbKeyID.value);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_blob(insertIntoRuleResultsStmt, /*index=*/2,
                               ruleResult.value.data(),
                               ruleResult.value.size(),
                               SQLITE_STATIC);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_int64(insertIntoRuleResultsStmt, /*index=*/3,
                               ruleResult.signature.value);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_int64(insertIntoRuleResultsStmt, /*index=*/4,
                                ruleResult.builtAt);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_int64(insertIntoRuleResultsStmt, /*index=*/5,
                                ruleResult.computedAt);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_double(insertIntoRuleResultsStmt, /*index=*/6,
                                ruleResult.start);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_double(insertIntoRuleResultsStmt, /*index=*/7,
                                ruleResult.end);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_bind_blob(insertIntoRuleResultsStmt, /*index=*/8,
                               encoder.data(),
                               encoder.size(),
                               SQLITE_STATIC);
    checkSQLiteResultOKReturnFalse(result);
    result = sqlite3_step(insertIntoRuleResultsStmt);
    if (result != SQLITE_DONE) {
      *error_out = getCurrentErrorMessage();
      return false;
    }

    return true;
  }